

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dumpBuffer
          (CLIntercept *this,string *name,uint64_t enqueueCounter,cl_mem memobj,
          cl_command_queue command_queue,void *ptr,size_t offset,size_t size)

{
  char *pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  iterator this_00;
  mapped_type_conflict *pmVar4;
  cl_icd_dispatch *pcVar5;
  cl_mem in_RCX;
  ulong in_RDX;
  string *in_RSI;
  CLIntercept *in_RDI;
  cl_command_queue in_R8;
  void *in_R9;
  undefined8 in_stack_00000008;
  long in_stack_00000010;
  cl_int error;
  size_t size_1;
  char enqueueCount [256];
  char offsetName [256];
  char bufferName [256];
  uint number;
  string fileName;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  lock_guard<std::mutex> *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffba8;
  Services_Common *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  Services_Common *in_stack_fffffffffffffbd0;
  cl_int local_3dc;
  size_t local_3d8;
  _Self local_3d0;
  _Self local_3c8;
  bool local_3b9;
  char local_3b8 [256];
  char local_2b8 [136];
  size_t in_stack_fffffffffffffdd0;
  void *in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffde7;
  string *in_stack_fffffffffffffde8;
  CLIntercept *in_stack_fffffffffffffdf0;
  char local_1b8 [264];
  cl_mem local_b0;
  uint local_a8;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  _Self local_58 [3];
  _Self local_40 [2];
  void *local_30;
  cl_command_queue local_28;
  cl_mem local_20;
  ulong local_18;
  string *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffb90,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
       ::find((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
               *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),(key_type *)0x211c84)
  ;
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
       ::end((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
              *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  bVar2 = std::operator!=(local_40,local_58);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    OS(in_RDI);
    pcVar1 = sc_DumpDirectoryName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
    ::OS::Services_Common::GetDumpDirectoryName
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::operator+=(local_78,"/memDumpCreateMapUnmap/");
    OS(in_RDI);
    ::OS::Services_Common::MakeDumpDirectories(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    std::__cxx11::string::operator+=(local_78,local_10);
    local_b0 = local_20;
    pmVar3 = std::
             map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
             ::operator[]((map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                           *)in_stack_fffffffffffffbd0,(key_type *)in_stack_fffffffffffffbc8);
    local_a8 = *pmVar3;
    snprintf(local_1b8,0x100,"%04u",(ulong)local_a8);
    std::__cxx11::string::operator+=(local_78,"_Buffer_");
    std::__cxx11::string::operator+=(local_78,local_1b8);
    snprintf(local_2b8,0x100,"%04zu",in_stack_00000008);
    std::__cxx11::string::operator+=(local_78,"_Offset_");
    std::__cxx11::string::operator+=(local_78,local_2b8);
    snprintf(local_3b8,0x100,"%04u",local_18 & 0xffffffff);
    std::__cxx11::string::operator+=(local_78,"_Enqueue_");
    std::__cxx11::string::operator+=(local_78,local_3b8);
    std::__cxx11::string::operator+=(local_78,".bin");
    if ((local_30 == (void *)0x0) || (in_stack_00000010 == 0)) {
      this_00 = std::
                map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                ::find((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                       (key_type *)0x212060);
      local_3c8._M_node = this_00._M_node;
      local_3d0._M_node =
           (_Base_ptr)
           std::
           map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
           ::end((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_3b9 = std::operator!=(&local_3c8,&local_3d0);
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_3b9);
      pmVar4 = std::
               map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
               ::operator[]((map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                             *)this_00._M_node,(key_type *)in_stack_fffffffffffffbc8);
      local_3d8 = *pmVar4;
      local_3dc = 0;
      pcVar5 = dispatch(in_RDI);
      local_30 = (*pcVar5->clEnqueueMapBuffer)
                           (local_28,local_20,1,1,0,local_3d8,0,(cl_event *)0x0,(cl_event *)0x0,
                            &local_3dc);
      if (local_3dc == 0) {
        config(in_RDI);
        dumpMemoryToFile(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         (bool)in_stack_fffffffffffffde7,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0);
        pcVar5 = dispatch(in_RDI);
        (*pcVar5->clEnqueueUnmapMemObject)
                  (local_28,local_20,local_30,0,(cl_event *)0x0,(cl_event *)0x0);
      }
    }
    else {
      config(in_RDI);
      dumpMemoryToFile(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                       (bool)in_stack_fffffffffffffde7,in_stack_fffffffffffffdd8,
                       in_stack_fffffffffffffdd0);
    }
    std::__cxx11::string::~string(local_78);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21224d);
  return;
}

Assistant:

void CLIntercept::dumpBuffer(
    const std::string& name,
    const uint64_t enqueueCounter,
    cl_mem memobj,
    cl_command_queue command_queue,
    void* ptr,
    size_t offset,
    size_t size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
    {
        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/memDumpCreateMapUnmap/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        fileName += name;

        // Add the buffer number to the file name
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            char    bufferName[ MAX_PATH ];

            CLI_SPRINTF( bufferName, MAX_PATH, "%04u", number );

            fileName += "_Buffer_";
            fileName += bufferName;
        }

        // Add the offset to the file name
        {
            char    offsetName[ MAX_PATH ];

            CLI_SPRINTF( offsetName, MAX_PATH, "%04zu",
                offset );

            fileName += "_Offset_";
            fileName += offsetName;
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );

            fileName += "_Enqueue_";
            fileName += enqueueCount;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        // There are two possibilities:
        // 1) We have a pointer and size already.  This might happen
        //    when the buffer is being created or was just mapped.
        //    In this case, we can just write this to the file.
        // 2) We have no pointer or size.  This usually happens when
        //    the buffer is being unmapped.  In this case, we'll
        //    map and dump the entire buffer.
        if( ptr != NULL && size != 0 )
        {
            dumpMemoryToFile(
                fileName,
                config().DumpBufferHashes,
                ptr,
                size );
        }
        else
        {
            // We should have checked this already...
            CLI_ASSERT( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() );

            size_t  size = m_BufferInfoMap[ memobj ];

            cl_int  error = CL_SUCCESS;
            ptr = dispatch().clEnqueueMapBuffer(
                command_queue,
                memobj,
                CL_TRUE,
                CL_MAP_READ,
                0,
                size,
                0,
                NULL,
                NULL,
                &error );
            if( error == CL_SUCCESS )
            {
                dumpMemoryToFile(
                    fileName,
                    config().DumpBufferHashes,
                    ptr,
                    size );

                dispatch().clEnqueueUnmapMemObject(
                    command_queue,
                    memobj,
                    ptr,
                    0,
                    NULL,
                    NULL );
            }
        }
    }
}